

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestUpdateHandler.cxx
# Opt level: O2

int __thiscall cmCTestUpdateHandler::DetectVCS(cmCTestUpdateHandler *this,string *dir)

{
  cmCTest *this_00;
  bool bVar1;
  ostream *poVar2;
  int iVar3;
  string sourceDirectory;
  char *local_1b0 [4];
  ostringstream cmCTestLog_msg;
  
  std::__cxx11::string::string((string *)&sourceDirectory,(string *)dir);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
  poVar2 = std::operator<<((ostream *)&cmCTestLog_msg,"Check directory: ");
  poVar2 = std::operator<<(poVar2,(string *)&sourceDirectory);
  std::endl<char,std::char_traits<char>>(poVar2);
  this_00 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(this_00,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestUpdateHandler.cxx"
               ,0x10a,local_1b0[0],(this->super_cmCTestGenericHandler).Quiet);
  std::__cxx11::string::~string((string *)local_1b0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  std::__cxx11::string::append((char *)&sourceDirectory);
  bVar1 = cmsys::SystemTools::FileExists(&sourceDirectory);
  if (bVar1) {
    iVar3 = 2;
  }
  else {
    cmStrCat<std::__cxx11::string_const&,char_const(&)[5]>
              ((string *)&cmCTestLog_msg,dir,(char (*) [5])"/CVS");
    std::__cxx11::string::operator=((string *)&sourceDirectory,(string *)&cmCTestLog_msg);
    std::__cxx11::string::~string((string *)&cmCTestLog_msg);
    bVar1 = cmsys::SystemTools::FileExists(&sourceDirectory);
    if (bVar1) {
      iVar3 = 1;
    }
    else {
      cmStrCat<std::__cxx11::string_const&,char_const(&)[6]>
                ((string *)&cmCTestLog_msg,dir,(char (*) [6])"/.bzr");
      std::__cxx11::string::operator=((string *)&sourceDirectory,(string *)&cmCTestLog_msg);
      std::__cxx11::string::~string((string *)&cmCTestLog_msg);
      bVar1 = cmsys::SystemTools::FileExists(&sourceDirectory);
      if (bVar1) {
        iVar3 = 3;
      }
      else {
        cmStrCat<std::__cxx11::string_const&,char_const(&)[6]>
                  ((string *)&cmCTestLog_msg,dir,(char (*) [6])"/.git");
        std::__cxx11::string::operator=((string *)&sourceDirectory,(string *)&cmCTestLog_msg);
        std::__cxx11::string::~string((string *)&cmCTestLog_msg);
        bVar1 = cmsys::SystemTools::FileExists(&sourceDirectory);
        if (bVar1) {
          iVar3 = 4;
        }
        else {
          cmStrCat<std::__cxx11::string_const&,char_const(&)[5]>
                    ((string *)&cmCTestLog_msg,dir,(char (*) [5])"/.hg");
          std::__cxx11::string::operator=((string *)&sourceDirectory,(string *)&cmCTestLog_msg);
          std::__cxx11::string::~string((string *)&cmCTestLog_msg);
          bVar1 = cmsys::SystemTools::FileExists(&sourceDirectory);
          if (bVar1) {
            iVar3 = 5;
          }
          else {
            cmStrCat<std::__cxx11::string_const&,char_const(&)[5]>
                      ((string *)&cmCTestLog_msg,dir,(char (*) [5])"/.p4");
            std::__cxx11::string::operator=((string *)&sourceDirectory,(string *)&cmCTestLog_msg);
            std::__cxx11::string::~string((string *)&cmCTestLog_msg);
            bVar1 = cmsys::SystemTools::FileExists(&sourceDirectory);
            if (bVar1) {
              iVar3 = 6;
            }
            else {
              cmStrCat<std::__cxx11::string_const&,char_const(&)[11]>
                        ((string *)&cmCTestLog_msg,dir,(char (*) [11])"/.p4config");
              std::__cxx11::string::operator=((string *)&sourceDirectory,(string *)&cmCTestLog_msg);
              std::__cxx11::string::~string((string *)&cmCTestLog_msg);
              bVar1 = cmsys::SystemTools::FileExists(&sourceDirectory);
              iVar3 = 6;
              if (!bVar1) {
                iVar3 = 0;
              }
            }
          }
        }
      }
    }
  }
  std::__cxx11::string::~string((string *)&sourceDirectory);
  return iVar3;
}

Assistant:

int cmCTestUpdateHandler::DetectVCS(const std::string& dir)
{
  std::string sourceDirectory = dir;
  cmCTestOptionalLog(this->CTest, DEBUG,
                     "Check directory: " << sourceDirectory << std::endl,
                     this->Quiet);
  sourceDirectory += "/.svn";
  if (cmSystemTools::FileExists(sourceDirectory)) {
    return cmCTestUpdateHandler::e_SVN;
  }
  sourceDirectory = cmStrCat(dir, "/CVS");
  if (cmSystemTools::FileExists(sourceDirectory)) {
    return cmCTestUpdateHandler::e_CVS;
  }
  sourceDirectory = cmStrCat(dir, "/.bzr");
  if (cmSystemTools::FileExists(sourceDirectory)) {
    return cmCTestUpdateHandler::e_BZR;
  }
  sourceDirectory = cmStrCat(dir, "/.git");
  if (cmSystemTools::FileExists(sourceDirectory)) {
    return cmCTestUpdateHandler::e_GIT;
  }
  sourceDirectory = cmStrCat(dir, "/.hg");
  if (cmSystemTools::FileExists(sourceDirectory)) {
    return cmCTestUpdateHandler::e_HG;
  }
  sourceDirectory = cmStrCat(dir, "/.p4");
  if (cmSystemTools::FileExists(sourceDirectory)) {
    return cmCTestUpdateHandler::e_P4;
  }
  sourceDirectory = cmStrCat(dir, "/.p4config");
  if (cmSystemTools::FileExists(sourceDirectory)) {
    return cmCTestUpdateHandler::e_P4;
  }
  return cmCTestUpdateHandler::e_UNKNOWN;
}